

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::MethodDescriptorProto::MergeFrom
          (MethodDescriptorProto *this,MethodDescriptorProto *from)

{
  byte bVar1;
  uint uVar2;
  LogMessage *other;
  MethodOptions *this_00;
  MethodOptions *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x10be);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  bVar1 = (byte)from->_has_bits_[0];
  uVar2 = (uint)bVar1;
  if (bVar1 != 0) {
    if ((bVar1 & 1) != 0) {
      set_name(this,from->name_);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 2) != 0) {
      set_input_type(this,from->input_type_);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 4) != 0) {
      set_output_type(this,from->output_type_);
      uVar2 = from->_has_bits_[0];
    }
    if ((uVar2 & 8) != 0) {
      this_00 = mutable_options(this);
      from_00 = from->options_;
      if (from_00 == (MethodOptions *)0x0) {
        from_00 = *(MethodOptions **)(default_instance_ + 0x28);
      }
      MethodOptions::MergeFrom(this_00,from_00);
    }
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void MethodDescriptorProto::MergeFrom(const MethodDescriptorProto& from) {
  GOOGLE_CHECK_NE(&from, this);
  if (from._has_bits_[0 / 32] & (0xffu << (0 % 32))) {
    if (from.has_name()) {
      set_name(from.name());
    }
    if (from.has_input_type()) {
      set_input_type(from.input_type());
    }
    if (from.has_output_type()) {
      set_output_type(from.output_type());
    }
    if (from.has_options()) {
      mutable_options()->::google::protobuf::MethodOptions::MergeFrom(from.options());
    }
  }
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}